

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_collations.cpp
# Opt level: O3

void duckdb::PragmaCollateFunction
               (ClientContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  GlobalTableFunctionState *pGVar1;
  _func_int **pp_Var2;
  pointer pcVar3;
  reference pvVar4;
  _func_int **pp_Var5;
  _func_int **__n;
  string local_90;
  Value local_70;
  
  optional_ptr<duckdb::GlobalTableFunctionState,_true>::CheckValid(&data_p->global_state);
  pGVar1 = (data_p->global_state).ptr;
  __n = pGVar1[4]._vptr_GlobalTableFunctionState;
  pp_Var5 = (_func_int **)
            ((long)pGVar1[2]._vptr_GlobalTableFunctionState -
             (long)pGVar1[1]._vptr_GlobalTableFunctionState >> 5);
  if (__n < pp_Var5) {
    if (__n + 0x100 < pp_Var5) {
      pp_Var5 = __n + 0x100;
    }
    output->count = (long)pp_Var5 - (long)__n;
    if (__n < (_func_int **)0xfffffffffffff800) {
      do {
        pp_Var2 = pGVar1[4]._vptr_GlobalTableFunctionState;
        pvVar4 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                               *)(pGVar1 + 1),(size_type)__n);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        pcVar3 = (pvVar4->_M_dataplus)._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,pcVar3,pcVar3 + pvVar4->_M_string_length);
        Value::Value(&local_70,&local_90);
        DataChunk::SetValue(output,0,(long)__n - (long)pp_Var2,&local_70);
        Value::~Value(&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        __n = (_func_int **)((long)__n + 1);
      } while (__n < pp_Var5);
    }
    pGVar1[4]._vptr_GlobalTableFunctionState = pp_Var5;
  }
  return;
}

Assistant:

static void PragmaCollateFunction(ClientContext &context, TableFunctionInput &data_p, DataChunk &output) {
	auto &data = data_p.global_state->Cast<PragmaCollateData>();
	if (data.offset >= data.entries.size()) {
		// finished returning values
		return;
	}
	idx_t next = MinValue<idx_t>(data.offset + STANDARD_VECTOR_SIZE, data.entries.size());
	output.SetCardinality(next - data.offset);
	for (idx_t i = data.offset; i < next; i++) {
		auto index = i - data.offset;
		output.SetValue(0, index, Value(data.entries[i]));
	}

	data.offset = next;
}